

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::Jump(BamMultiReaderPrivate *this,int refID,int position)

{
  bool bVar1;
  iterator iVar2;
  reference pMVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_> *in_RDI;
  BamReader *reader;
  MergeItem *item;
  iterator readerEnd;
  iterator readerIter;
  BamMultiReaderPrivate *in_stack_00000068;
  __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
  *in_stack_ffffffffffffffd0;
  
  iVar2 = std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
          ::begin(in_RDI);
  std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>::end
            (in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffffd0,
                            (__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
                             *)in_RDI), bVar1) {
    pMVar3 = __gnu_cxx::
             __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
             ::operator*((__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
                          *)&stack0xffffffffffffffe8);
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
          *)pMVar3->Reader;
    if (in_stack_ffffffffffffffd0 !=
        (__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
         *)0x0) {
      BamReader::Jump((BamReader *)CONCAT44(in_ESI,in_EDX),(int)((ulong)iVar2._M_current >> 0x20),
                      (int)iVar2._M_current);
    }
    __gnu_cxx::
    __normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
    ::operator++((__normal_iterator<BamTools::Internal::MergeItem_*,_std::vector<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>_>
                  *)&stack0xffffffffffffffe8);
  }
  bVar1 = UpdateAlignmentCache(in_stack_00000068);
  return bVar1;
}

Assistant:

bool BamMultiReaderPrivate::Jump(int refID, int position)
{

    // NB: While it may make sense to track readers in which we can
    // successfully Jump, in practice a failure of Jump means "no
    // alignments here."  It makes sense to simply accept the failure,
    // UpdateAlignments(), and continue.

    // iterate over readers
    std::vector<MergeItem>::iterator readerIter = m_readers.begin();
    std::vector<MergeItem>::iterator readerEnd = m_readers.end();
    for (; readerIter != readerEnd; ++readerIter) {
        MergeItem& item = (*readerIter);
        BamReader* reader = item.Reader;
        if (reader == 0) {
            continue;
        }

        // jump in each BamReader to position of interest
        reader->Jump(refID, position);
    }

    // returns status of cache update
    return UpdateAlignmentCache();
}